

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSparseResourcesTestsUtil.cpp
# Opt level: O1

Move<vk::Handle<(vk::HandleType)12>_> *
vkt::sparse::makeBufferView
          (Move<vk::Handle<(vk::HandleType)12>_> *__return_storage_ptr__,DeviceInterface *vk,
          VkDevice vkDevice,VkBuffer buffer,VkFormat format,VkDeviceSize offset,VkDeviceSize size)

{
  VkBufferViewCreateInfo local_40;
  
  local_40.sType = VK_STRUCTURE_TYPE_BUFFER_VIEW_CREATE_INFO;
  local_40.pNext = (void *)0x0;
  local_40.flags = 0;
  local_40.range = size;
  local_40.buffer.m_internal = buffer.m_internal;
  local_40.format = format;
  local_40.offset = offset;
  ::vk::createBufferView(__return_storage_ptr__,vk,vkDevice,&local_40,(VkAllocationCallbacks *)0x0);
  return __return_storage_ptr__;
}

Assistant:

Move<VkBufferView> makeBufferView (const DeviceInterface&	vk,
								   const VkDevice			vkDevice,
								   const VkBuffer			buffer,
								   const VkFormat			format,
								   const VkDeviceSize		offset,
								   const VkDeviceSize		size)
{
	const VkBufferViewCreateInfo bufferViewParams =
	{
		VK_STRUCTURE_TYPE_BUFFER_VIEW_CREATE_INFO,	// VkStructureType			sType;
		DE_NULL,									// const void*				pNext;
		0u,											// VkBufferViewCreateFlags	flags;
		buffer,										// VkBuffer					buffer;
		format,										// VkFormat					format;
		offset,										// VkDeviceSize				offset;
		size,										// VkDeviceSize				range;
	};
	return createBufferView(vk, vkDevice, &bufferViewParams);
}